

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

ARTConflictType __thiscall
duckdb::ART::InsertIntoInlined
          (ART *this,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
          optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  optional_ptr<duckdb::ART,_true> this_00;
  int iVar1;
  unsafe_optional_ptr<const_Node> uVar2;
  optional_ptr<duckdb::ART,_true> local_38;
  
  local_38.ptr = delete_art.ptr;
  iVar1 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])();
  if ((append_mode != INSERT_DUPLICATES) && ((byte)((char)iVar1 - 1U) < 2)) {
    if (delete_art.ptr == (ART *)0x0) {
      return append_mode != IGNORE_DUPLICATES;
    }
    optional_ptr<duckdb::ART,_true>::CheckValid(&local_38);
    this_00.ptr = local_38.ptr;
    optional_ptr<duckdb::ART,_true>::CheckValid(&local_38);
    uVar2 = Lookup(this_00.ptr,&(local_38.ptr)->tree,key,0);
    if (uVar2.ptr == (Node *)0x0) {
      return CONSTRAINT;
    }
    if ((((node->super_IndexPointer).data ^ ((uVar2.ptr)->super_IndexPointer).data) &
        0xffffffffffffff) != 0) {
      return CONSTRAINT;
    }
  }
  Leaf::InsertIntoInlined(this,node,row_id,depth,status);
  return NO_CONFLICT;
}

Assistant:

ARTConflictType ART::InsertIntoInlined(Node &node, const ARTKey &key, const idx_t depth, const ARTKey &row_id,
                                       const GateStatus status, optional_ptr<ART> delete_art,
                                       const IndexAppendMode append_mode) {

	if (!IsUnique() || append_mode == IndexAppendMode::INSERT_DUPLICATES) {
		Leaf::InsertIntoInlined(*this, node, row_id, depth, status);
		return ARTConflictType::NO_CONFLICT;
	}

	if (!delete_art) {
		if (append_mode == IndexAppendMode::IGNORE_DUPLICATES) {
			return ARTConflictType::NO_CONFLICT;
		}
		return ARTConflictType::CONSTRAINT;
	}

	// Lookup in the delete_art.
	auto delete_leaf = delete_art->Lookup(delete_art->tree, key, 0);
	if (!delete_leaf) {
		return ARTConflictType::CONSTRAINT;
	}

	// The row ID has changed.
	// Thus, the local index has a newer (local) row ID, and this is a constraint violation.
	D_ASSERT(delete_leaf->GetType() == NType::LEAF_INLINED);
	auto deleted_row_id = delete_leaf->GetRowId();
	auto this_row_id = node.GetRowId();
	if (deleted_row_id != this_row_id) {
		return ARTConflictType::CONSTRAINT;
	}

	// The deleted key and its row ID match the current key and its row ID.
	Leaf::InsertIntoInlined(*this, node, row_id, depth, status);
	return ARTConflictType::NO_CONFLICT;
}